

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O2

drwav_bool32
drwav_preinit_write(drwav *pWav,drwav_data_format *pFormat,drwav_bool32 isSequential,
                   drwav_write_proc onWrite,drwav_seek_proc onSeek,void *pUserData,
                   drwav_allocation_callbacks *pAllocationCallbacks)

{
  drwav_uint32 dVar1;
  drwav_uint32 dVar2;
  drwav_uint32 dVar3;
  uint uVar4;
  code *pcVar5;
  code *pcVar6;
  code *pcVar7;
  void *pvVar8;
  drwav_bool32 dVar9;
  drwav_bool32 dVar10;
  
  dVar9 = 0;
  dVar10 = 0;
  if ((((onWrite != (drwav_write_proc)0x0 && pWav != (drwav *)0x0) &&
       (isSequential != 0 || onSeek != (drwav_seek_proc)0x0)) &&
      (dVar1 = pFormat->format, dVar10 = dVar9, dVar1 != 2)) &&
     ((dVar1 != 0x11 && (dVar1 != 0xfffe)))) {
    dVar10 = 0;
    memset(pWav,0,0x1b8);
    pWav->onWrite = onWrite;
    pWav->onSeek = onSeek;
    pWav->pUserData = pUserData;
    if (pAllocationCallbacks == (drwav_allocation_callbacks *)0x0) {
      pcVar5 = drwav__malloc_default;
      pcVar6 = drwav__realloc_default;
      pcVar7 = drwav__free_default;
      pvVar8 = (void *)0x0;
    }
    else {
      pvVar8 = pAllocationCallbacks->pUserData;
      pcVar5 = pAllocationCallbacks->onMalloc;
      pcVar6 = pAllocationCallbacks->onRealloc;
      pcVar7 = pAllocationCallbacks->onFree;
    }
    (pWav->allocationCallbacks).pUserData = pvVar8;
    (pWav->allocationCallbacks).onMalloc = pcVar5;
    (pWav->allocationCallbacks).onRealloc = pcVar6;
    (pWav->allocationCallbacks).onFree = pcVar7;
    if ((pcVar7 != (_func_void_void_ptr_void_ptr *)0x0) &&
       (pcVar5 != (_func_void_ptr_size_t_void_ptr *)0x0 ||
        pcVar6 != (_func_void_ptr_void_ptr_size_t_void_ptr *)0x0)) {
      (pWav->fmt).formatTag = (drwav_uint16)pFormat->format;
      dVar1 = pFormat->channels;
      (pWav->fmt).channels = (drwav_uint16)dVar1;
      dVar2 = pFormat->sampleRate;
      (pWav->fmt).sampleRate = dVar2;
      dVar3 = pFormat->bitsPerSample;
      uVar4 = dVar1 * dVar3;
      (pWav->fmt).avgBytesPerSec = dVar2 * uVar4 >> 3;
      (pWav->fmt).blockAlign = (drwav_uint16)(uVar4 >> 3);
      (pWav->fmt).bitsPerSample = (drwav_uint16)dVar3;
      pWav->isSequentialWrite = isSequential;
      dVar10 = 1;
    }
  }
  return dVar10;
}

Assistant:

static drwav_bool32 drwav_preinit_write(drwav* pWav, const drwav_data_format* pFormat, drwav_bool32 isSequential, drwav_write_proc onWrite, drwav_seek_proc onSeek, void* pUserData, const drwav_allocation_callbacks* pAllocationCallbacks)
{
    if (pWav == NULL || onWrite == NULL) {
        return DRWAV_FALSE;
    }

    if (!isSequential && onSeek == NULL) {
        return DRWAV_FALSE; /* <-- onSeek is required when in non-sequential mode. */
    }

    /* Not currently supporting compressed formats. Will need to add support for the "fact" chunk before we enable this. */
    if (pFormat->format == DR_WAVE_FORMAT_EXTENSIBLE) {
        return DRWAV_FALSE;
    }
    if (pFormat->format == DR_WAVE_FORMAT_ADPCM || pFormat->format == DR_WAVE_FORMAT_DVI_ADPCM) {
        return DRWAV_FALSE;
    }

    DRWAV_ZERO_MEMORY(pWav, sizeof(*pWav));
    pWav->onWrite   = onWrite;
    pWav->onSeek    = onSeek;
    pWav->pUserData = pUserData;
    pWav->allocationCallbacks = drwav_copy_allocation_callbacks_or_defaults(pAllocationCallbacks);

    if (pWav->allocationCallbacks.onFree == NULL || (pWav->allocationCallbacks.onMalloc == NULL && pWav->allocationCallbacks.onRealloc == NULL)) {
        return DRWAV_FALSE;    /* Invalid allocation callbacks. */
    }

    pWav->fmt.formatTag = (drwav_uint16)pFormat->format;
    pWav->fmt.channels = (drwav_uint16)pFormat->channels;
    pWav->fmt.sampleRate = pFormat->sampleRate;
    pWav->fmt.avgBytesPerSec = (drwav_uint32)((pFormat->bitsPerSample * pFormat->sampleRate * pFormat->channels) / 8);
    pWav->fmt.blockAlign = (drwav_uint16)((pFormat->channels * pFormat->bitsPerSample) / 8);
    pWav->fmt.bitsPerSample = (drwav_uint16)pFormat->bitsPerSample;
    pWav->fmt.extendedSize = 0;
    pWav->isSequentialWrite = isSequential;

    return DRWAV_TRUE;
}